

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# scene.cpp
# Opt level: O0

void __thiscall pbrt::BasicSceneBuilder::EndOfFiles(BasicSceneBuilder *this)

{
  bool bVar1;
  span<pbrt::ShapeSceneEntity> *in_RDI;
  BasicScene *unaff_retaddr;
  span<pbrt::ShapeSceneEntity> in_stack_00000008;
  char *in_stack_ffffffffffffffb8;
  ParserTarget *in_stack_ffffffffffffffc0;
  ShapeSceneEntity *in_stack_ffffffffffffffc8;
  char *in_stack_fffffffffffffff0;
  
  if ((int)in_RDI[1].n != 1) {
    ParserTarget::ErrorExitDeferred<>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
  }
  while (bVar1 = std::
                 vector<pbrt::BasicSceneBuilder::GraphicsState,_std::allocator<pbrt::BasicSceneBuilder::GraphicsState>_>
                 ::empty((vector<pbrt::BasicSceneBuilder::GraphicsState,_std::allocator<pbrt::BasicSceneBuilder::GraphicsState>_>
                          *)in_RDI), ((bVar1 ^ 0xffU) & 1) != 0) {
    ParserTarget::ErrorExitDeferred<>(in_stack_ffffffffffffffc0,in_stack_ffffffffffffffb8);
    std::
    vector<pbrt::BasicSceneBuilder::GraphicsState,_std::allocator<pbrt::BasicSceneBuilder::GraphicsState>_>
    ::pop_back((vector<pbrt::BasicSceneBuilder::GraphicsState,_std::allocator<pbrt::BasicSceneBuilder::GraphicsState>_>
                *)0x848367);
  }
  if (((ulong)in_RDI->n & 1) == 0) {
    bVar1 = std::vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_>::empty
                      ((vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *)
                       in_RDI);
    if (!bVar1) {
      in_stack_ffffffffffffffc8 = in_RDI[1].ptr;
      pstd::span<pbrt::ShapeSceneEntity>::span<pbrt::ShapeSceneEntity>
                (in_RDI,(vector<pbrt::ShapeSceneEntity,_std::allocator<pbrt::ShapeSceneEntity>_> *)
                        in_stack_ffffffffffffffc8);
      BasicScene::AddShapes(unaff_retaddr,in_stack_00000008);
    }
    bVar1 = std::vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_>::
            empty((vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_> *)
                  in_RDI);
    if (!bVar1) {
      pstd::span<pbrt::InstanceSceneEntity>::span<pbrt::InstanceSceneEntity>
                ((span<pbrt::InstanceSceneEntity> *)in_RDI,
                 (vector<pbrt::InstanceSceneEntity,_std::allocator<pbrt::InstanceSceneEntity>_> *)
                 in_stack_ffffffffffffffc8);
      BasicScene::AddInstanceUses(unaff_retaddr,(span<pbrt::InstanceSceneEntity>)in_stack_00000008);
    }
    BasicScene::Done((BasicScene *)in_RDI[1].ptr);
    return;
  }
  ErrorExit<>(in_stack_fffffffffffffff0);
}

Assistant:

void BasicSceneBuilder::EndOfFiles() {
    if (currentBlock != BlockState::WorldBlock)
        ErrorExitDeferred("End of files before \"WorldBegin\".");

    // Ensure there are no pushed graphics states
    while (!pushedGraphicsStates.empty()) {
        ErrorExitDeferred("Missing end to AttributeBegin");
        pushedGraphicsStates.pop_back();
    }

    if (errorExit)
        ErrorExit("Fatal errors during scene construction");

    if (!shapes.empty())
        scene->AddShapes(shapes);
    if (!instanceUses.empty())
        scene->AddInstanceUses(instanceUses);

    scene->Done();
}